

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O1

void __thiscall DataBuffer::writeStringIndex(DataBuffer *this,String *a)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  
  checkSpace(this,4);
  iVar2 = 0;
  do {
    pcVar1 = this->m_position;
    this->m_position = pcVar1 + 1;
    *pcVar1 = (char)(0x23 >> ((byte)iVar2 & 0x1f));
    iVar2 = iVar2 + 8;
  } while (iVar2 != 0x20);
  iVar2 = getStringTableIndex(a);
  checkSpace(this,4);
  iVar3 = 0;
  do {
    pcVar1 = this->m_position;
    this->m_position = pcVar1 + 1;
    *pcVar1 = (char)(iVar2 >> ((byte)iVar3 & 0x1f));
    iVar3 = iVar3 + 8;
  } while (iVar3 != 0x20);
  return;
}

Assistant:

void DataBuffer::writeStringIndex (const String& a)
{
	writeHeader (DataHeader::PushStringIndex);
	writeDWord (getStringTableIndex (a));
}